

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.hpp
# Opt level: O2

Error * __thiscall
ot::commissioner::CommissionerImpl::AnnounceBegin
          (Error *__return_storage_ptr__,CommissionerImpl *this,uint32_t param_1,uint8_t param_2,
          uint16_t param_3,string *param_4)

{
  format_args args;
  string sStack_48;
  undefined1 local_28 [24];
  
  args.field_1.values_ = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)param_4
  ;
  args.desc_ = (unsigned_long_long)local_28;
  ::fmt::v10::vformat_abi_cxx11_
            (&sStack_48,(v10 *)(anon_var_dwarf_307b52 + 9),(string_view)ZEXT816(0),args);
  __return_storage_ptr__->mCode = kUnimplemented;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->mMessage,(string *)&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  return __return_storage_ptr__;
}

Assistant:

Error AnnounceBegin(uint32_t, uint8_t, uint16_t, const std::string &) override { return ERROR_UNIMPLEMENTED(""); }